

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

int __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
::erase_unique<S2CellId>
          (btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           *this,S2CellId *key)

{
  bool bVar1;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
  bVar2;
  
  bVar2._8_8_ = 0;
  bVar2.node = (this->root_).
               super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
               .
               super_Storage<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_2UL,_false>
               .value;
  bVar2 = btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
          ::
          internal_find_unique<S2CellId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>,std::pair<S2CellId_const,S2ShapeIndexCell*>&,std::pair<S2CellId_const,S2ShapeIndexCell*>*>>
                    ((btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                      *)this,key,bVar2);
  bVar1 = bVar2.node !=
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           *)0x0;
  if (bVar1) {
    erase(this,bVar2);
  }
  return (uint)bVar1;
}

Assistant:

int btree<P>::erase_unique(const K &key) {
  iterator iter = internal_find_unique(key, iterator(root(), 0));
  if (!iter.node) {
    // The key doesn't exist in the tree, return nothing done.
    return 0;
  }
  erase(iter);
  return 1;
}